

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Write<int> __thiscall Omega_h::unmap<int>(Omega_h *this,LOs *a2b,Read<int> *b_data,Int width)

{
  int size_in;
  char *file;
  void *extraout_RDX;
  Write<int> WVar1;
  undefined1 local_148 [8];
  type f;
  string local_108 [35];
  byte local_e5;
  int local_e4;
  __cxx11 local_e0 [4];
  LO na;
  allocator local_a9;
  string local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [35];
  ScopedTimer local_45;
  Int local_44;
  ScopedTimer omega_h_scoped_function_timer;
  Read<int> *pRStack_40;
  Int width_local;
  Read<int> *b_data_local;
  LOs *a2b_local;
  Write<int> *a_data;
  ulong local_10;
  
  local_44 = width;
  pRStack_40 = b_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_a9);
  std::operator+(local_88,(char *)local_a8);
  std::__cxx11::to_string(local_e0,0x4c);
  std::operator+(local_68,local_88);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_45,"unmap",file);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  local_e4 = (int)(local_10 >> 2);
  local_e5 = 0;
  size_in = local_e4 * local_44;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,"",(allocator *)((long)&f.b_data.write_.shared_alloc_.direct_ptr + 7));
  Write<int>::Write((Write<int> *)this,size_in,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&f.b_data.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read((Read<int> *)local_148,a2b);
  f.a2b.write_.shared_alloc_.direct_ptr._0_4_ = local_44;
  Write<int>::Write((Write<int> *)&f.width,(Write<int> *)this);
  Read<int>::Read((Read<int> *)&f.a_data.shared_alloc_.direct_ptr,b_data);
  parallel_for<Omega_h::unmap<int>(Omega_h::Read<int>,Omega_h::Read<int>,int)::_lambda(int)_1_>
            (local_e4,(type *)local_148);
  local_e5 = 1;
  unmap<int>(Omega_h::Read<int>,Omega_h::Read<int>,int)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_148);
  if ((local_e5 & 1) == 0) {
    Write<int>::~Write((Write<int> *)this);
  }
  ScopedTimer::~ScopedTimer(&local_45);
  WVar1.shared_alloc_.direct_ptr = extraout_RDX;
  WVar1.shared_alloc_.alloc = (Alloc *)this;
  return (Write<int>)WVar1.shared_alloc_;
}

Assistant:

Write<T> unmap(LOs a2b, Read<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  Write<T> a_data(na * width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      a_data[a * width + j] = b_data[b * width + j];
    }
  };
  parallel_for(na, std::move(f));
  return a_data;
}